

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O2

string * __thiscall antlr::Token::toString_abi_cxx11_(string *__return_storage_ptr__,Token *this)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  (*this->_vptr_Token[4])(&local_38);
  std::operator+(&bStack_98,"[\"",&local_38);
  std::operator+(&local_78,&bStack_98,"\",<");
  antlr::operator+(&local_58,&local_78,this->type);
  std::operator+(__return_storage_ptr__,&local_58,">]");
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&local_78);
  std::__cxx11::string::~string((string *)&bStack_98);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

string Token::toString() const
{
	return "[\""+getText()+"\",<"+type+">]";
}